

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offBasePtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  BYTE *pBVar1;
  U32 UVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  BYTE *pBVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong *puVar17;
  char cVar18;
  int iVar19;
  uint *puVar20;
  long lVar21;
  ulong *puVar22;
  uint uVar23;
  uint uVar24;
  uint *puVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  BYTE *pInLoopLimit_1;
  BYTE *pBVar29;
  uint uVar30;
  ulong *puVar31;
  ulong uVar32;
  uint uVar33;
  BYTE *pBVar34;
  ulong *puVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  U32 UVar39;
  uint uVar40;
  uint uVar41;
  U32 *pUVar42;
  ulong uVar43;
  BYTE *pInLoopLimit;
  U32 dummy32;
  uint local_124;
  ulong local_118;
  uint *local_108;
  BYTE *local_f0;
  uint *local_e8;
  ulong local_c8;
  uint local_68;
  uint local_64;
  U32 *local_60;
  ulong local_58;
  U32 *local_50;
  BYTE *local_48;
  BYTE *local_40;
  ulong *local_38;
  
  uVar23 = (ms->cParams).hashLog;
  if (0x20 < uVar23) goto LAB_006d4e66;
  local_58 = (ulong)(mls - 5);
  cVar18 = (char)uVar23;
  switch(local_58) {
  case 0:
    lVar21 = -0x30e4432345000000;
    break;
  case 1:
    lVar21 = -0x30e4432340650000;
    break;
  case 2:
    lVar21 = -0x30e44323405a9d00;
    break;
  case 3:
    local_c8 = (ulong)(*(long *)ip * -0x30e44323485a9b9d) >> (-cVar18 & 0x3fU);
    goto LAB_006d421c;
  default:
    local_c8 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar18 & 0x1fU));
    goto LAB_006d421c;
  }
  local_c8 = (ulong)(lVar21 * *(long *)ip) >> (-cVar18 & 0x3fU);
LAB_006d421c:
  pBVar3 = (ms->window).base;
  uVar36 = (int)ip - (int)pBVar3;
  UVar2 = (ms->window).lowLimit;
  uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  UVar39 = uVar36 - uVar23;
  if (uVar36 - UVar2 <= uVar23) {
    UVar39 = UVar2;
  }
  if (ms->loadedDictEnd != 0) {
    UVar39 = UVar2;
  }
  uVar40 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar23 = uVar36 - uVar40;
  if (uVar36 < uVar40) {
    uVar23 = 0;
  }
  uVar28 = UVar39;
  if (UVar39 < uVar23) {
    uVar28 = uVar23;
  }
  local_124 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  if (iend + -8 < ip) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x107,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if (dictMode == ZSTD_dedicatedDictSearch) {
    __assert_fail("dictMode != ZSTD_dedicatedDictSearch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x108,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_50 = ms->hashTable;
  pUVar42 = ms->chainTable;
  uVar41 = local_50[local_c8];
  local_60 = pUVar42;
  if (uVar28 < uVar41) {
    uVar12 = 0;
    uVar26 = local_124;
    do {
      uVar32 = (ulong)uVar41;
      uVar13 = (ulong)((uVar41 & uVar40) * 2);
      if ((pUVar42[uVar13 + 1] != 1) || (uVar26 < 2)) {
        if (pUVar42[uVar13 + 1] == 1) {
          (pUVar42 + uVar13)[0] = 0;
          (pUVar42 + uVar13)[1] = 0;
        }
        uVar32 = uVar12;
        if ((U32)uVar12 == 0) goto LAB_006d46fe;
        break;
      }
      pUVar42[uVar13 + 1] = (U32)uVar12;
      uVar26 = uVar26 - 1;
      uVar41 = pUVar42[uVar13];
      uVar12 = uVar32;
    } while (uVar28 < uVar41);
    local_f0 = (ms->window).dictBase;
    do {
      uVar41 = (ms->window).dictLimit;
      uVar12 = (ulong)uVar41;
      local_38 = (ulong *)(local_f0 + uVar12);
      uVar24 = (uint)uVar32;
      puVar35 = (ulong *)iend;
      pBVar34 = pBVar3;
      if (uVar24 < uVar41) {
        puVar35 = local_38;
        pBVar34 = local_f0;
      }
      UVar2 = (ms->window).lowLimit;
      uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar38 = uVar24 - uVar33;
      if (uVar24 - UVar2 <= uVar33) {
        uVar38 = UVar2;
      }
      if (uVar24 < uVar28) {
        __assert_fail("curr >= btLow",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x60,
                      "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                     );
      }
      puVar22 = (ulong *)(pBVar34 + uVar32);
      if (puVar35 <= puVar22) {
        __assert_fail("ip < iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x61,
                      "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                     );
      }
      uVar33 = pUVar42[(ulong)((uVar24 & uVar40) * 2) + 1];
      uVar37 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar30 = (uVar24 & uVar37) * 2;
      local_e8 = pUVar42 + uVar30;
      puVar20 = local_e8 + 1;
      if ((uVar26 != 0) && (uVar30 = pUVar42[uVar30], uVar38 < uVar30)) {
        local_40 = pBVar3 + uVar12;
        local_48 = pBVar34 + uVar32 + 8;
        uVar13 = 0;
        uVar32 = 0;
        uVar27 = uVar26;
        do {
          uVar10 = uVar32;
          if (uVar13 < uVar32) {
            uVar10 = uVar13;
          }
          if (uVar24 <= uVar30) {
            __assert_fail("matchIndex < curr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                          ,0x66,
                          "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                         );
          }
          uVar43 = (ulong)uVar30;
          uVar14 = uVar10 + uVar43;
          pBVar34 = pBVar3;
          if (dictMode == ZSTD_extDict) {
            if ((uVar24 < uVar41) || (uVar12 <= uVar14)) {
              if (uVar14 < uVar12) {
                pBVar34 = local_f0;
              }
              goto LAB_006d452d;
            }
            sVar9 = ZSTD_count_2segments
                              ((byte *)((long)puVar22 + uVar10),local_f0 + uVar43 + uVar10,
                               (BYTE *)puVar35,(BYTE *)local_38,local_40);
            uVar10 = sVar9 + uVar10;
            pUVar42 = local_60;
            pBVar34 = pBVar3 + uVar43;
            if (uVar10 + uVar43 < uVar12) {
              pBVar34 = local_f0 + uVar43;
            }
          }
          else {
LAB_006d452d:
            if ((uVar41 <= uVar24) && (uVar14 < uVar12)) {
              __assert_fail("(matchIndex+matchLength >= dictLimit) || (curr < dictLimit)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x72,
                            "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                           );
            }
            puVar17 = (ulong *)((long)puVar22 + uVar10);
            puVar31 = (ulong *)(pBVar34 + uVar43 + uVar10);
            puVar11 = puVar17;
            if (puVar17 < (ulong *)((long)puVar35 - 7U)) {
              if (*puVar31 == *puVar17) {
                lVar21 = 0;
                do {
                  puVar11 = (ulong *)(local_48 + lVar21 + uVar10);
                  if ((ulong *)((long)puVar35 - 7U) <= puVar11) {
                    puVar31 = (ulong *)(pBVar34 + lVar21 + uVar14 + 8);
                    goto LAB_006d45e2;
                  }
                  lVar8 = lVar21 + uVar14 + 8;
                  lVar21 = lVar21 + 8;
                } while (*(ulong *)(pBVar34 + lVar8) == *puVar11);
                uVar16 = *puVar11 ^ *(ulong *)(pBVar34 + lVar8);
                uVar14 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                  }
                }
                uVar14 = (uVar14 >> 3 & 0x1fffffff) + lVar21;
              }
              else {
                uVar16 = *puVar17 ^ *puVar31;
                uVar14 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                  }
                }
                uVar14 = uVar14 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_006d45e2:
              if ((puVar11 < (ulong *)((long)puVar35 - 3U)) && ((int)*puVar31 == (int)*puVar11)) {
                puVar11 = (ulong *)((long)puVar11 + 4);
                puVar31 = (ulong *)((long)puVar31 + 4);
              }
              if ((puVar11 < (ulong *)((long)puVar35 - 1U)) && ((short)*puVar31 == (short)*puVar11))
              {
                puVar11 = (ulong *)((long)puVar11 + 2);
                puVar31 = (ulong *)((long)puVar31 + 2);
              }
              if (puVar11 < puVar35) {
                puVar11 = (ulong *)((long)puVar11 + (ulong)((byte)*puVar31 == (byte)*puVar11));
              }
              uVar14 = (long)puVar11 - (long)puVar17;
            }
            uVar10 = uVar14 + uVar10;
            pBVar34 = pBVar34 + uVar43;
          }
          if ((ulong *)((long)puVar22 + uVar10) == puVar35) break;
          puVar25 = pUVar42 + (uVar30 & uVar37) * 2;
          if (pBVar34[uVar10] < (byte)*(ulong *)((long)puVar22 + uVar10)) {
            *local_e8 = uVar30;
            if (uVar30 <= uVar28) {
              local_e8 = &local_64;
              break;
            }
            puVar25 = puVar25 + 1;
            uVar13 = uVar10;
            local_e8 = puVar25;
          }
          else {
            *puVar20 = uVar30;
            uVar32 = uVar10;
            puVar20 = puVar25;
            if (uVar30 <= uVar28) {
              puVar20 = &local_64;
              break;
            }
          }
          uVar27 = uVar27 - 1;
          if ((uVar27 == 0) || (uVar30 = *puVar25, uVar30 <= uVar38)) break;
        } while( true );
      }
      *puVar20 = 0;
      *local_e8 = 0;
      uVar26 = uVar26 + 1;
      uVar32 = (ulong)uVar33;
    } while (uVar33 != 0);
  }
  else {
LAB_006d46fe:
    local_f0 = (ms->window).dictBase;
  }
  uVar32 = (ulong)(ms->window).dictLimit;
  uVar12 = (ulong)((uVar40 & uVar36) * 2);
  local_108 = pUVar42 + uVar12;
  puVar20 = pUVar42 + uVar12 + 1;
  uVar41 = uVar36 + 9;
  uVar28 = local_50[local_c8];
  local_50[local_c8] = uVar36;
  if (UVar39 < uVar28) {
    uVar12 = 0;
    uVar13 = 0;
    uVar10 = 0;
    do {
      uVar43 = (ulong)uVar28;
      uVar14 = uVar13;
      if (uVar10 < uVar13) {
        uVar14 = uVar10;
      }
      uVar16 = uVar14 + uVar43;
      puVar35 = (ulong *)(ip + uVar14);
      if ((dictMode == ZSTD_extDict) && (uVar16 < uVar32)) {
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)puVar35,local_f0 + uVar43 + uVar14,iend,local_f0 + uVar32,
                           pBVar3 + uVar32);
        uVar14 = sVar9 + uVar14;
        pBVar34 = pBVar3 + uVar43;
        if (uVar14 + uVar43 < uVar32) {
          pBVar34 = local_f0 + uVar43;
        }
      }
      else {
        puVar22 = (ulong *)(pBVar3 + uVar43 + uVar14);
        puVar17 = puVar35;
        if (puVar35 < iend + -7) {
          if (*puVar22 == *puVar35) {
            lVar21 = 0;
            do {
              puVar17 = (ulong *)(ip + lVar21 + uVar14 + 8);
              if (iend + -7 <= puVar17) {
                puVar22 = (ulong *)(pBVar3 + uVar16 + lVar21 + 8);
                goto LAB_006d48df;
              }
              lVar8 = lVar21 + uVar16 + 8;
              lVar21 = lVar21 + 8;
            } while (*(ulong *)(pBVar3 + lVar8) == *puVar17);
            uVar15 = *puVar17 ^ *(ulong *)(pBVar3 + lVar8);
            uVar16 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
              }
            }
            uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar21;
          }
          else {
            uVar15 = *puVar35 ^ *puVar22;
            uVar16 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
              }
            }
            uVar16 = uVar16 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_006d48df:
          if ((puVar17 < iend + -3) && ((int)*puVar22 == (int)*puVar17)) {
            puVar17 = (ulong *)((long)puVar17 + 4);
            puVar22 = (ulong *)((long)puVar22 + 4);
          }
          if ((puVar17 < iend + -1) && ((short)*puVar22 == (short)*puVar17)) {
            puVar17 = (ulong *)((long)puVar17 + 2);
            puVar22 = (ulong *)((long)puVar22 + 2);
          }
          if (puVar17 < iend) {
            puVar17 = (ulong *)((long)puVar17 + (ulong)((char)*puVar22 == (char)*puVar17));
          }
          uVar16 = (long)puVar17 - (long)puVar35;
        }
        uVar14 = uVar16 + uVar14;
        pBVar34 = pBVar3 + uVar43;
      }
      if (uVar12 < uVar14) {
        if (uVar41 - uVar28 < uVar14) {
          uVar41 = uVar28 + (int)uVar14;
        }
        uVar26 = (uVar36 - uVar28) + 1;
        if ((uVar26 == 0) || (uVar24 = (uint)*offBasePtr, uVar24 == 0)) goto LAB_006d4e28;
        iVar19 = 0x1f;
        if (uVar26 != 0) {
          for (; uVar26 >> iVar19 == 0; iVar19 = iVar19 + -1) {
          }
        }
        iVar6 = 0x1f;
        if (uVar24 != 0) {
          for (; uVar24 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        if (iVar19 - iVar6 < ((int)uVar14 - (int)uVar12) * 4) {
          if (uVar36 == uVar28) {
            __assert_fail("(curr - matchIndex)>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                          ,0x14e,
                          "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                         );
          }
          *offBasePtr = (ulong)((uVar36 - uVar28) + 3);
          uVar12 = uVar14;
        }
        if (ip + uVar14 == iend) {
          if (dictMode == ZSTD_dictMatchState) {
            *puVar20 = 0;
            *local_108 = 0;
            goto LAB_006d4d55;
          }
          goto LAB_006d4a73;
        }
      }
      puVar25 = local_60 + (uVar28 & uVar40) * 2;
      if (pBVar34[uVar14] < ip[uVar14]) {
        *local_108 = uVar28;
        if (uVar28 <= uVar23) {
          local_108 = &local_68;
          goto LAB_006d4a73;
        }
        puVar25 = puVar25 + 1;
        uVar10 = uVar14;
        local_108 = puVar25;
      }
      else {
        *puVar20 = uVar28;
        uVar13 = uVar14;
        puVar20 = puVar25;
        if (uVar28 <= uVar23) {
          puVar20 = &local_68;
          goto LAB_006d4a73;
        }
      }
      local_124 = local_124 - 1;
      if ((local_124 == 0) || (uVar28 = *puVar25, uVar28 <= UVar39)) goto LAB_006d4a73;
    } while( true );
  }
  uVar12 = 0;
LAB_006d4a73:
  *puVar20 = 0;
  *local_108 = 0;
  if (0x40000000 < local_124) {
    __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x16b,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if ((dictMode == ZSTD_dictMatchState) && (local_124 != 0)) {
    pZVar4 = ms->dictMatchState;
    uVar23 = (pZVar4->cParams).hashLog;
    if (0x20 < uVar23) {
LAB_006d4e66:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    if ((uint)local_58 < 4) {
      sVar9 = (*(code *)(&DAT_0083b868 + *(int *)(&DAT_0083b868 + local_58 * 4)))
                        (&DAT_0083b868 + *(int *)(&DAT_0083b868 + local_58 * 4));
      return sVar9;
    }
    pBVar34 = (pZVar4->window).nextSrc;
    pBVar5 = (pZVar4->window).base;
    uVar32 = (long)pBVar34 - (long)pBVar5;
    uVar40 = (pZVar4->window).lowLimit;
    uVar26 = ~(-1 << ((char)(pZVar4->cParams).chainLog - 1U & 0x1f));
    iVar19 = (int)uVar32;
    uVar28 = iVar19 - uVar26;
    if (iVar19 - uVar40 <= uVar26) {
      uVar28 = uVar40;
    }
    uVar23 = pZVar4->hashTable[(uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar23 & 0x1fU)];
    if (uVar40 < uVar23) {
      uVar24 = (ms->window).dictLimit;
      uVar38 = (ms->window).lowLimit - iVar19;
      pUVar42 = pZVar4->chainTable;
      uVar13 = 0;
      local_118 = 0;
      do {
        local_124 = local_124 - 1;
        uVar14 = (ulong)uVar23;
        uVar10 = uVar13;
        if (local_118 < uVar13) {
          uVar10 = local_118;
        }
        pBVar1 = pBVar5 + uVar14;
        sVar9 = ZSTD_count_2segments(ip + uVar10,pBVar1 + uVar10,iend,pBVar34,pBVar3 + uVar24);
        uVar10 = sVar9 + uVar10;
        pBVar29 = pBVar3 + uVar14 + uVar38;
        if (uVar10 + uVar14 < (uVar32 & 0xffffffff)) {
          pBVar29 = pBVar1;
        }
        if (uVar12 < uVar10) {
          uVar33 = uVar23 + uVar38;
          iVar19 = uVar36 - uVar33;
          uVar30 = iVar19 + 1;
          if ((uVar30 == 0) || (uVar37 = (int)*offBasePtr + 1, uVar37 == 0)) {
LAB_006d4e28:
            __assert_fail("val != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                          ,0xab,"unsigned int ZSTD_highbit32(U32)");
          }
          iVar6 = 0x1f;
          if (uVar30 != 0) {
            for (; uVar30 >> iVar6 == 0; iVar6 = iVar6 + -1) {
            }
          }
          iVar7 = 0x1f;
          if (uVar37 != 0) {
            for (; uVar37 >> iVar7 == 0; iVar7 = iVar7 + -1) {
            }
          }
          if (iVar6 - iVar7 < ((int)uVar10 - (int)uVar12) * 4) {
            if (uVar36 == uVar33) {
              __assert_fail("(curr - matchIndex)>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0xcc,
                            "size_t ZSTD_DUBT_findBetterDictMatch(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, size_t, U32, const U32, const ZSTD_dictMode_e)"
                           );
            }
            *offBasePtr = (ulong)(iVar19 + 3);
            uVar12 = uVar10;
          }
          if (ip + uVar10 == iend) break;
        }
        puVar20 = pUVar42 + (uVar23 & uVar26) * 2;
        if (pBVar29[uVar10] < ip[uVar10]) {
          if (uVar23 <= uVar28) break;
          puVar20 = puVar20 + 1;
          local_118 = uVar10;
        }
        else {
          uVar13 = uVar10;
          if (uVar23 <= uVar28) break;
        }
        if ((local_124 == 0) || (uVar23 = *puVar20, uVar23 <= uVar40)) break;
      } while( true );
    }
    if ((2 < uVar12) && (*offBasePtr < 4)) {
      __assert_fail("OFFBASE_IS_OFFSET(*offsetPtr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,0xe0,
                    "size_t ZSTD_DUBT_findBetterDictMatch(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, size_t, U32, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
LAB_006d4d55:
  if (uVar41 <= uVar36 + 8) {
    __assert_fail("matchEndIdx > curr+8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x173,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ms->nextToUpdate = uVar41 - 8;
  if ((2 < uVar12) && (*offBasePtr < 4)) {
    __assert_fail("OFFBASE_IS_OFFSET(*offBasePtr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x176,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  return uVar12;
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offBasePtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const curr = (U32)(ip-base);
    U32    const windowLow = ZSTD_getLowestMatchIndex(ms, curr, cParams->windowLog);

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= curr) ? 0 : curr - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", curr);
    assert(ip <= iend-8);   /* required for h calculation */
    assert(dictMode != ZSTD_dedicatedDictSearch);

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(curr&btMask);
        U32* largerPtr  = bt + 2*(curr&btMask) + 1;
        U32 matchEndIdx = curr + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = curr;   /* Update Hash Table */

        for (; nbCompares && (matchIndex > windowLow); --nbCompares) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(curr - matchIndex + 1) - ZSTD_highbit32((U32)*offBasePtr)) )
                    bestLength = matchLength, *offBasePtr = OFFSET_TO_OFFBASE(curr - matchIndex);
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        assert(nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)); /* Check we haven't underflowed. */
        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offBasePtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > curr+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = curr - (U32)OFFBASE_TO_OFFSET(*offBasePtr); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        curr, (U32)bestLength, (U32)*offBasePtr, mIndex);
        }
        return bestLength;
    }
}